

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HApp.cpp
# Opt level: O0

int solveSCIP(char *filename)

{
  double dVar1;
  uint uVar2;
  byte bVar3;
  uint uVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  double *pdVar9;
  uint *puVar10;
  HDual *this;
  double rsdu;
  int col;
  int num_resolve;
  double nw_colUpper;
  double nw_colLower;
  int colBoundIndex;
  double og_colUpper;
  double og_colLower;
  vector<double,_std::allocator<double>_> rowUpper;
  vector<double,_std::allocator<double>_> rowLower;
  vector<double,_std::allocator<double>_> rowDual;
  vector<double,_std::allocator<double>_> rowPrimal;
  vector<double,_std::allocator<double>_> colUpper;
  vector<double,_std::allocator<double>_> colLower;
  vector<double,_std::allocator<double>_> colDual;
  vector<double,_std::allocator<double>_> colPrimal;
  HDual solver;
  int nnonz;
  vector<double,_std::allocator<double>_> X0Avalue;
  vector<int,_std::allocator<int>_> X0Aindex;
  vector<int,_std::allocator<int>_> X0Astart;
  vector<double,_std::allocator<double>_> X0colUpper;
  vector<double,_std::allocator<double>_> X0colLower;
  vector<double,_std::allocator<double>_> X0colCost;
  int num0ExtractCols;
  vector<double,_std::allocator<double>_> X0ARvalue;
  vector<int,_std::allocator<int>_> X0ARindex;
  vector<int,_std::allocator<int>_> X0ARstart;
  vector<double,_std::allocator<double>_> X0rowUpper;
  vector<double,_std::allocator<double>_> X0rowLower;
  int num0ExtractRows;
  vector<double,_std::allocator<double>_> XARvalue;
  vector<int,_std::allocator<int>_> XARindex;
  vector<int,_std::allocator<int>_> XARstart;
  vector<double,_std::allocator<double>_> XrowUpper;
  vector<double,_std::allocator<double>_> XrowLower;
  int numExtractRows;
  int ToRow;
  int FmRow;
  vector<double,_std::allocator<double>_> XAvalue;
  vector<int,_std::allocator<int>_> XAindex;
  vector<int,_std::allocator<int>_> XAstart;
  vector<double,_std::allocator<double>_> XcolUpper;
  vector<double,_std::allocator<double>_> XcolLower;
  vector<double,_std::allocator<double>_> XcolCost;
  int numExtractCols;
  int ToCol;
  int FmCol;
  int RtCd;
  HModel model;
  HModel *in_stack_fffffffffffe9dc0;
  undefined7 in_stack_fffffffffffe9dc8;
  undefined1 in_stack_fffffffffffe9dcf;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffe9dd0;
  vector<double,_std::allocator<double>_> *this_00;
  HDual *in_stack_fffffffffffe9e20;
  double dStack_16050;
  double dStack_16048;
  double dStack_16040;
  uint uStack_16038;
  int iStack_16034;
  double dStack_16030;
  double dStack_16028;
  uint uStack_1601c;
  double dStack_16018;
  double adStack_16010 [2];
  vector<double,_std::allocator<double>_> vStack_16000;
  vector<double,_std::allocator<double>_> avStack_15fe0 [2];
  vector avStack_15fa0 [32];
  vector<double,_std::allocator<double>_> vStack_15f80;
  vector<double,_std::allocator<double>_> vStack_15f60;
  vector avStack_15f40 [32];
  vector<double,_std::allocator<double>_> vStack_15f20;
  HModel aHStack_15f08 [84760];
  vector<double,_std::allocator<double>_> local_13f0;
  vector<int,_std::allocator<int>_> local_13d8;
  vector<int,_std::allocator<int>_> local_13c0;
  vector<double,_std::allocator<double>_> local_13a8;
  vector<double,_std::allocator<double>_> local_1390;
  vector<double,_std::allocator<double>_> local_1378;
  uint local_135c;
  vector<double,_std::allocator<double>_> local_1358;
  vector<int,_std::allocator<int>_> local_1340;
  vector<int,_std::allocator<int>_> local_1328;
  vector<double,_std::allocator<double>_> local_1310;
  vector<double,_std::allocator<double>_> local_12f8;
  uint local_12dc;
  vector<double,_std::allocator<double>_> local_12d8;
  vector<int,_std::allocator<int>_> local_12c0;
  vector<int,_std::allocator<int>_> local_12a8;
  vector<double,_std::allocator<double>_> local_1290;
  vector<double,_std::allocator<double>_> local_1278;
  uint local_125c;
  int local_1258;
  int local_1254;
  vector<double,_std::allocator<double>_> local_1250;
  vector<int,_std::allocator<int>_> local_1238;
  vector<int,_std::allocator<int>_> local_1220;
  vector<double,_std::allocator<double>_> local_1208;
  vector<double,_std::allocator<double>_> local_11f0;
  vector<double,_std::allocator<double>_> local_11d8;
  uint local_11c0;
  int local_11bc;
  int local_11b8;
  undefined4 local_11b4;
  int local_11b0;
  HModel local_11a0 [1548];
  uint local_b94;
  uint local_b90;
  int local_b8c;
  vector<int,_std::allocator<int>_> avStack_a38 [108];
  int local_4;
  
  HModel::HModel(local_11a0);
  printf("Called solveSCIP\n");
  std::ostream::operator<<((ostream *)&std::cout,std::flush<char,std::char_traits<char>>);
  local_11b0 = HModel::load_fromMPS((char *)local_11a0);
  if (local_11b0 == 0) {
    local_11b8 = local_b94 - 3;
    local_11bc = local_b94 - 1;
    local_11c0 = (local_11bc - local_11b8) + 1;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x10a275);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x10a282);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x10a28f);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x10a29c);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x10a2a9);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x10a2b6);
    HModel::util_deleteCols((int)local_11a0,local_11b8);
    local_1254 = local_b90 - 3;
    local_1258 = local_b90 - 1;
    local_125c = (local_1258 - local_1254) + 1;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x10a31a);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x10a327);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x10a334);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x10a341);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x10a34e);
    HModel::util_deleteRows((int)local_11a0,local_1254);
    local_1254 = 0;
    local_1258 = local_b90 - 1;
    local_12dc = local_b90;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x10a3ac);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x10a3b9);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x10a3c6);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x10a3d3);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x10a3e0);
    HModel::util_deleteRows((int)local_11a0,local_1254);
    local_11b8 = 0;
    local_11bc = local_b94 - 1;
    local_135c = local_b94;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x10a43e);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x10a44b);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x10a458);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x10a465);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x10a472);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x10a47f);
    HModel::util_deleteCols((int)local_11a0,local_11b8);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_1378,0);
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_1390,0);
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&local_13a8,0);
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_13c0,0);
    pdVar9 = (double *)std::vector<int,_std::allocator<int>_>::operator[](&local_13d8,0);
    std::vector<double,_std::allocator<double>_>::operator[](&local_13f0,0);
    HModel::util_addCols
              ((int)local_11a0,(double *)(ulong)local_135c,pvVar5,pvVar6,(int)pvVar7,(int *)0x0,
               pvVar8,pdVar9);
    puVar10 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                (&local_1328,(long)(int)local_12dc);
    uVar4 = *puVar10;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_12f8,0);
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_1310,0);
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_1328,0);
    pdVar9 = (double *)std::vector<int,_std::allocator<int>_>::operator[](&local_1340,0);
    std::vector<double,_std::allocator<double>_>::operator[](&local_1358,0);
    HModel::util_addRows
              ((int)local_11a0,(double *)(ulong)local_12dc,pvVar5,(int)pvVar6,(int *)(ulong)uVar4,
               pvVar8,pdVar9);
    puVar10 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                (&local_12a8,(long)(int)local_125c);
    uVar2 = local_125c;
    uVar4 = *puVar10;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_1278,0);
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_1290,0);
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_12a8,0);
    pdVar9 = (double *)std::vector<int,_std::allocator<int>_>::operator[](&local_12c0,0);
    std::vector<double,_std::allocator<double>_>::operator[](&local_12d8,0);
    HModel::util_addRows
              ((int)local_11a0,(double *)(ulong)uVar2,pvVar5,(int)pvVar6,(int *)(ulong)uVar4,pvVar8,
               pdVar9);
    puVar10 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                (&local_1220,(long)(int)local_11c0);
    uVar2 = local_11c0;
    uVar4 = *puVar10;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_11d8,0);
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_11f0,0);
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&local_1208,0);
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_1220,0);
    pdVar9 = (double *)std::vector<int,_std::allocator<int>_>::operator[](&local_1238,0);
    std::vector<double,_std::allocator<double>_>::operator[](&local_1250,0);
    HModel::util_addCols
              ((int)local_11a0,(double *)(ulong)uVar2,pvVar5,pvVar6,(int)pvVar7,(int *)(ulong)uVar4,
               pvVar8,pdVar9);
    local_b8c = local_b94 + local_b90;
    HModel::scaleModel();
    HDual::HDual(in_stack_fffffffffffe9e20);
    HDual::solve(aHStack_15f08,(int)local_11a0,0);
    HModel::util_reportModelSolution();
    HModel::util_reportSolverOutcome((char *)local_11a0);
    std::allocator<double>::allocator((allocator<double> *)0x10a9de);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffe9dd0,
               CONCAT17(in_stack_fffffffffffe9dcf,in_stack_fffffffffffe9dc8),
               (allocator_type *)in_stack_fffffffffffe9dc0);
    std::allocator<double>::~allocator((allocator<double> *)0x10aa0a);
    std::allocator<double>::allocator((allocator<double> *)0x10aa2f);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffe9dd0,
               CONCAT17(in_stack_fffffffffffe9dcf,in_stack_fffffffffffe9dc8),
               (allocator_type *)in_stack_fffffffffffe9dc0);
    std::allocator<double>::~allocator((allocator<double> *)0x10aa5b);
    std::allocator<double>::allocator((allocator<double> *)0x10aa80);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffe9dd0,
               CONCAT17(in_stack_fffffffffffe9dcf,in_stack_fffffffffffe9dc8),
               (allocator_type *)in_stack_fffffffffffe9dc0);
    std::allocator<double>::~allocator((allocator<double> *)0x10aaac);
    std::allocator<double>::allocator((allocator<double> *)0x10aad1);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffe9dd0,
               CONCAT17(in_stack_fffffffffffe9dcf,in_stack_fffffffffffe9dc8),
               (allocator_type *)in_stack_fffffffffffe9dc0);
    std::allocator<double>::~allocator((allocator<double> *)0x10aafd);
    std::allocator<double>::allocator((allocator<double> *)0x10ab22);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffe9dd0,
               CONCAT17(in_stack_fffffffffffe9dcf,in_stack_fffffffffffe9dc8),
               (allocator_type *)in_stack_fffffffffffe9dc0);
    std::allocator<double>::~allocator((allocator<double> *)0x10ab4e);
    std::allocator<double>::allocator((allocator<double> *)0x10ab73);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffe9dd0,
               CONCAT17(in_stack_fffffffffffe9dcf,in_stack_fffffffffffe9dc8),
               (allocator_type *)in_stack_fffffffffffe9dc0);
    std::allocator<double>::~allocator((allocator<double> *)0x10ab9f);
    std::allocator<double>::allocator((allocator<double> *)0x10abc4);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffe9dd0,
               CONCAT17(in_stack_fffffffffffe9dcf,in_stack_fffffffffffe9dc8),
               (allocator_type *)in_stack_fffffffffffe9dc0);
    std::allocator<double>::~allocator((allocator<double> *)0x10abf0);
    this = (HDual *)(long)(int)local_b90;
    std::allocator<double>::allocator((allocator<double> *)0x10ac12);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffe9dd0,
               CONCAT17(in_stack_fffffffffffe9dcf,in_stack_fffffffffffe9dc8),
               (allocator_type *)in_stack_fffffffffffe9dc0);
    std::allocator<double>::~allocator((allocator<double> *)0x10ac3b);
    HModel::util_getPrimalDualValues
              ((vector *)local_11a0,(vector *)&vStack_15f20,avStack_15f40,avStack_15fa0);
    uVar4 = local_b94 - 1;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&vStack_15f60,0);
    std::vector<double,_std::allocator<double>_>::operator[](&vStack_15f80,0);
    HModel::util_getColBounds((int)local_11a0,0,(double *)(ulong)uVar4,pvVar5);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](avStack_15fe0,0);
    std::vector<double,_std::allocator<double>_>::operator[](&vStack_16000,0);
    HModel::util_getRowBounds((int)local_11a0,0,(double *)(ulong)(local_b90 - 1),pvVar5);
    iStack_16034 = 0;
    for (uStack_16038 = 0; (int)uStack_16038 < (int)local_b94; uStack_16038 = uStack_16038 + 1) {
      HModel::util_getColBounds
                ((int)local_11a0,uStack_16038,(double *)(ulong)uStack_16038,adStack_16010);
      uVar4 = uStack_16038;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&vStack_15f20,(long)(int)uStack_16038);
      printf("\nColumn %2d has primal value %11g and bounds [%11g, %11g]",*pvVar5,adStack_16010[0],
             dStack_16018,(ulong)uVar4);
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         (avStack_a38,(long)(int)uStack_16038);
      if (*pvVar8 == 0) {
        this_00 = &vStack_15f20;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           (this_00,(long)(int)uStack_16038);
        dVar1 = dStack_16018;
        dStack_16048 = *pvVar5 - adStack_16010[0];
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           (this_00,(long)(int)uStack_16038);
        dStack_16050 = dVar1 - *pvVar5;
        pdVar9 = std::min<double>(&dStack_16048,&dStack_16050);
        dStack_16040 = *pdVar9;
        if (0.1 <= dStack_16040) {
          printf(": basic with rsdu = %11g so branch\n\n",dStack_16040);
          iStack_16034 = iStack_16034 + 1;
          uStack_1601c = uStack_16038;
          bVar3 = HModel::hsol_isInfinity(dStack_16018);
          if ((bVar3 & 1) == 0) {
            dStack_16028 = dStack_16018;
          }
          else {
            pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&vStack_15f20,(long)(int)uStack_16038);
            dStack_16028 = *pvVar5 + 1.0;
          }
          dStack_16030 = dStack_16018;
          printf("Calling model.util_chgColBounds(1, %d, %g, %g)\n",dStack_16028,dStack_16018,
                 (ulong)uStack_1601c);
          HModel::util_chgColBoundsSet
                    ((int)local_11a0,(int *)0x1,(double *)&uStack_1601c,&dStack_16028);
          printf("Calling model.scaleModel()\n");
          HModel::scaleModel();
          HDual::solve(aHStack_15f08,(int)local_11a0,0);
          HModel::util_reportSolverOutcome((char *)local_11a0);
          HModel::util_chgColBoundsSet
                    ((int)local_11a0,(int *)0x1,(double *)&uStack_1601c,adStack_16010);
          if (9 < iStack_16034) break;
        }
        else {
          printf(": basic but rsdu = %11g so don\'t branch\n",dStack_16040);
        }
      }
      else {
        printf(": nonbasic so don\'t branch\n");
      }
    }
    printf("Returning from solveSCIP\n");
    std::ostream::operator<<((ostream *)&std::cout,std::flush<char,std::char_traits<char>>);
    local_4 = 0;
    local_11b4 = 1;
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffe9dc0);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffe9dc0);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffe9dc0);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffe9dc0);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffe9dc0);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffe9dc0);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffe9dc0);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffe9dc0);
    HDual::~HDual(this);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffe9dc0);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffe9dc0);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffe9dc0);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffe9dc0);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffe9dc0);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffe9dc0);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffe9dc0);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffe9dc0);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffe9dc0);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffe9dc0);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffe9dc0);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffe9dc0);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffe9dc0);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffe9dc0);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffe9dc0);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffe9dc0);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffe9dc0);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffe9dc0);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffe9dc0);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffe9dc0);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffe9dc0);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffe9dc0);
  }
  else {
    local_11b4 = 1;
    local_4 = local_11b0;
  }
  HModel::~HModel(in_stack_fffffffffffe9dc0);
  return local_4;
}

Assistant:

int solveSCIP(const char *filename) {
  HModel model;
  printf("Called solveSCIP\n");cout << flush;
  int RtCd = model.load_fromMPS(filename);
  if (RtCd) return RtCd;
  //  model.util_reportModel();

  //Extract columns numCol-3..numCol-1
  int FmCol = model.numCol-3;
  int ToCol = model.numCol-1;
  int numExtractCols = ToCol-FmCol+1;
  vector<double> XcolCost;
  vector<double> XcolLower;
  vector<double> XcolUpper;
  vector<int> XAstart;
  vector<int> XAindex;
  vector<double> XAvalue;
  //  model.util_extractCols(FmCol, ToCol, XcolCost, XcolLower, XcolUpper,
  //			 XAstart, XAindex, XAvalue);

  //  printf("Returned from model.util_extractCols with\n");
  //  model.util_reportColVec(numExtractCols, XcolCost, XcolLower, XcolUpper);
  //  model.util_reportColMtx(numExtractCols, XAstart, XAindex, XAvalue);
  
  //Delete the columns just extracted
  model.util_deleteCols(FmCol, ToCol);
  //  model.util_reportModel();

  //Extract rows numRow-3..numRow-1
  int FmRow = model.numRow-3;
  int ToRow = model.numRow-1;
  int numExtractRows = ToRow-FmRow+1;
  vector<double> XrowLower;
  vector<double> XrowUpper;
  vector<int> XARstart;
  vector<int> XARindex;
  vector<double> XARvalue;
  //  model.util_extractRows(FmRow, ToRow, &(*XrowLower.begin()), &(*XrowUpper.begin()),
  // &(*XARstart.begin()), &(*XARindex.begin()), &(*XARvalue.begin()));

  //  printf("Returned from model.util_extractRows with\n");
  //  model.util_reportRowVec(numExtractRows, XrowLower, XrowUpper);
  //  model.util_reportRowMtx(numExtractRows, XARstart, XARindex, XARvalue);
  
  //Delete the rows just extracted
  model.util_deleteRows(FmRow, ToRow);
  //  model.util_reportModel();

  //Extract all remaining rows
  FmRow = 0;
  ToRow = model.numRow-1;
  int num0ExtractRows = ToRow-FmRow+1;
  vector<double> X0rowLower;
  vector<double> X0rowUpper;
  vector<int> X0ARstart;
  vector<int> X0ARindex;
  vector<double> X0ARvalue;

  //model.util_extractRows(FmRow, ToRow, &(*X0rowLower.begin()), &(*X0rowUpper.begin()),
  //			 &(*X0ARstart.begin()), &(*X0ARindex.begin()), &(*X0ARvalue.begin()));

  //Delete the rows just extracted
  model.util_deleteRows(FmRow, ToRow);
  //  model.util_reportModel();

  //Extract all remaining columns
  FmCol = 0;
  ToCol = model.numCol-1;
  int num0ExtractCols = ToCol-FmCol+1;
  vector<double> X0colCost;
  vector<double> X0colLower;
  vector<double> X0colUpper;
  vector<int> X0Astart;
  vector<int> X0Aindex;
  vector<double> X0Avalue;
  //  model.util_extractCols(FmCol, ToCol, X0colCost, X0colLower, X0colUpper,
  //			 X0Astart, X0Aindex, X0Avalue);
  
  //Delete the columns just extracted
  model.util_deleteCols(FmCol, ToCol);
  //  model.util_reportModel();

  int nnonz = 0;
  model.util_addCols(num0ExtractCols, &X0colCost[0], &X0colLower[0], &X0colUpper[0],
		     nnonz, &X0Astart[0], &X0Aindex[0], &X0Avalue[0]);
  //  model.util_reportModel();
  
  nnonz = X0ARstart[num0ExtractRows];
  model.util_addRows(num0ExtractRows, &X0rowLower[0], &X0rowUpper[0],
		     nnonz, &X0ARstart[0], &X0ARindex[0], &X0ARvalue[0]);
  //  model.util_reportModel();

  nnonz = XARstart[numExtractRows];
  model.util_addRows(numExtractRows, &XrowLower[0], &XrowUpper[0],
		     nnonz, &XARstart[0], &XARindex[0], &XARvalue[0]);
  //  model.util_reportModel();

  nnonz = XAstart[numExtractCols];
  model.util_addCols(numExtractCols, &XcolCost[0], &XcolLower[0], &XcolUpper[0],
		     nnonz, &XAstart[0], &XAindex[0], &XAvalue[0]);
  //  model.util_reportModel();
  
  model.numTot = model.numCol + model.numRow;
  model.scaleModel();
  HDual solver;
  solver.solve(&model);
  model.util_reportModelSolution();
  model.util_reportSolverOutcome("SCIP 1");

  vector<double> colPrimal(model.numCol);
  vector<double> colDual(model.numCol);
  vector<double> colLower(model.numCol);
  vector<double> colUpper(model.numCol);
  vector<double> rowPrimal(model.numRow);
  vector<double> rowDual(model.numRow);
  vector<double> rowLower(model.numRow);
  vector<double> rowUpper(model.numRow);
  model.util_getPrimalDualValues(colPrimal, colDual, rowPrimal, rowDual);
  model.util_getColBounds(0, model.numCol-1, &colLower[0], &colUpper[0]);
  model.util_getRowBounds(0, model.numRow-1, &rowLower[0], &rowUpper[0]);

  double og_colLower;
  double og_colUpper;
  int colBoundIndex;
  double nw_colLower;
  double nw_colUpper;

  int num_resolve = 0;
  for (int col = 0; col < model.numCol; col++) {
    model.util_getColBounds(col, col, &og_colLower, &og_colUpper);
    printf("\nColumn %2d has primal value %11g and bounds [%11g, %11g]", col, colPrimal[col], og_colLower, og_colUpper);
    if (model.nonbasicFlag[col]) {
      printf(": nonbasic so don't branch\n");
      continue;
    } else {
      double rsdu = min(colPrimal[col]-og_colLower, og_colUpper-colPrimal[col]);
      if (rsdu < 0.1) {
	printf(": basic but rsdu = %11g so don't branch\n", rsdu);
	continue;
      }
      printf(": basic with rsdu = %11g so branch\n\n", rsdu);
      num_resolve++;
      colBoundIndex = col;
      if (model.hsol_isInfinity(og_colUpper)) 
	nw_colLower = colPrimal[col]+1;
      else
	nw_colLower = og_colUpper;
      nw_colUpper = og_colUpper;
      printf("Calling model.util_chgColBounds(1, %d, %g, %g)\n", colBoundIndex, nw_colLower, nw_colUpper);
      model.util_chgColBoundsSet(1, &colBoundIndex, &nw_colLower, &nw_colUpper);
      printf("Calling model.scaleModel()\n");
      model.scaleModel();
      //      printf("Calling solver.solve(&model)\n");
      solver.solve(&model);
      //      printf("Called solver.solve(&model)\n");
      model.util_reportSolverOutcome("SCIP 2");
      //Was &nw_colLower, &nw_colUpper); and might be more interesting for avgas
      model.util_chgColBoundsSet(1, &colBoundIndex, &og_colLower, &og_colUpper);
      if (num_resolve >= 10) break;
    }
  }
  printf("Returning from solveSCIP\n"); cout << flush;
  return 0;
}